

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnElemSegmentElemExpr_RefFunc
          (BinaryReaderObjdump *this,Index segment_index,Index func_index)

{
  string_view sVar1;
  
  PrintDetails(this,"  - elem[%lu] = func[%u]",(ulong)this->elem_index_ + this->elem_offset_,
               (ulong)func_index);
  sVar1 = BinaryReaderObjdumpBase::GetFunctionName(&this->super_BinaryReaderObjdumpBase,func_index);
  if (sVar1._M_len != 0) {
    PrintDetails(this," <%.*s>",(ulong)(uint)sVar1._M_len,sVar1._M_str);
  }
  PrintDetails(this,"\n");
  this->elem_index_ = this->elem_index_ + 1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnElemSegmentElemExpr_RefFunc(Index segment_index,
                                                          Index func_index) {
  PrintDetails("  - elem[%" PRIu64 "] = func[%" PRIindex "]",
               elem_offset_ + elem_index_, func_index);
  auto name = GetFunctionName(func_index);
  if (!name.empty()) {
    PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  PrintDetails("\n");
  elem_index_++;
  return Result::Ok;
}